

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateJsonNameConflictProto2_Test::
TestBody(ValidationErrorTest_ValidateJsonNameConflictProto2_Test *this)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "name: \'foo.proto\' syntax: \'proto2\' message_type {  name: \'Foo\'  field { name:\'AB\' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }  field { name:\'_a__b_\' number:2 label:LABEL_OPTIONAL type:TYPE_INT32 }}"
             ,&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "foo.proto: Foo: NAME: The default JSON name of field \"_a__b_\" (\"AB\") conflicts with the default JSON name of field \"AB\".\n"
             ,&local_4a);
  ValidationErrorTest::BuildFileWithWarnings(&this->super_ValidationErrorTest,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateJsonNameConflictProto2) {
  BuildFileWithWarnings(
      "name: 'foo.proto' "
      "syntax: 'proto2' "
      "message_type {"
      "  name: 'Foo'"
      "  field { name:'AB' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "  field { name:'_a__b_' number:2 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "}",
      "foo.proto: Foo: NAME: The default JSON name of field \"_a__b_\" "
      "(\"AB\") "
      "conflicts with the default JSON name of field \"AB\".\n");
}